

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O1

Type * __thiscall
mnf::Manifold::getConstView<2,0>
          (Type *__return_storage_ptr__,Manifold *this,ConstRefMat *val,size_t param_2,size_t ic)

{
  PointerType pdVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined4 extraout_var_00;
  
  iVar3 = (*this->_vptr_Manifold[7])(this);
  if (ic < CONCAT44(extraout_var,iVar3)) {
    iVar3 = (*this->_vptr_Manifold[0xf])(this,ic);
    uVar4 = CONCAT44(extraout_var_00,iVar3);
    iVar3 = (*this->_vptr_Manifold[7])(this);
    if (ic < CONCAT44(extraout_var_01,iVar3)) {
      iVar3 = (*this->_vptr_Manifold[8])(this,ic);
      uVar5 = representationDim((Manifold *)CONCAT44(extraout_var_02,iVar3));
      pdVar1 = (val->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      uVar7 = (val->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      lVar2 = (val->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      (__return_storage_ptr__->
      super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true>,_0>
      .m_data = pdVar1 + lVar2 * uVar4;
      (__return_storage_ptr__->
      super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true>,_0>
      .m_rows.m_value = uVar7;
      (__return_storage_ptr__->
      super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true>,_0>
      .m_cols.m_value = uVar5;
      uVar7 = uVar7 | uVar5;
      if ((long)uVar7 < 0 && pdVar1 != (PointerType)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, -1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, -1, -1, true>, Level = 0]"
                     );
      }
      (__return_storage_ptr__->
      super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_true>
      .m_xpr = val;
      (__return_storage_ptr__->
      super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_true>
      .m_startRow.m_value = 0;
      (__return_storage_ptr__->
      super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_true>
      .m_startCol.m_value = uVar4;
      (__return_storage_ptr__->
      super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_true,_true>
      .m_outerStride = lVar2;
      if ((-1 < (long)(uVar7 | uVar4)) &&
         ((long)uVar4 <=
          (long)((val->
                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value - uVar5))) {
        return __return_storage_ptr__;
      }
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, -1, -1, true>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = -1, InnerPanel = true]"
                   );
    }
  }
  uVar6 = __cxa_allocate_exception(1);
  __cxa_throw(uVar6,&mnf_exception::typeinfo,0);
}

Assistant:

inline typename ConstViewReturnType<F, R>::Type Manifold::getConstView<F, R>(
    const ConstRefMat& val, size_t, size_t ic) const
{
  return val.middleCols(getStart<R>(ic), getDim<R>(ic));
}